

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Refal2::CParser::parsingBlank(CParser *this)

{
  bool bVar1;
  TTokenType TVar2;
  code *pcVar3;
  
  TVar2 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type;
  if (TVar2 == TT_Word) {
    bVar1 = CDirectiveParser::StartParseIfDirective(&this->super_CDirectiveParser);
    if (bVar1) {
      pcVar3 = parsingDirective;
      goto LAB_0012c116;
    }
    TVar2 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type;
  }
  if (TVar2 == TT_LineFeed) {
    pcVar3 = parsingInitial;
  }
  else {
    bVar1 = CRuleParser::BeginRule((CRuleParser *)this);
    if (bVar1) {
      this->state = (TState)parsingRule;
      *(undefined8 *)&this->field_0x1f68 = 0;
      AddToken(this);
      return;
    }
    pcVar3 = parsingIgnoreLine;
  }
LAB_0012c116:
  this->state = (TState)pcVar3;
  *(undefined8 *)&this->field_0x1f68 = 0;
  return;
}

Assistant:

void CParser::parsingBlank()
{
	if( token.type == TT_Word && CDirectiveParser::StartParseIfDirective() ) {
		state = &CParser::parsingDirective;
	} else if( token.type == TT_LineFeed ) {
		state = &CParser::parsingInitial;
	} else {
		if( !CRuleParser::BeginRule() ) {
			state = &CParser::parsingIgnoreLine;
			return;
		}
		state = &CParser::parsingRule;
		AddToken();
	}
}